

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImageSelectiveBlur(gdImagePtr src)

{
  uint uVar1;
  gdImagePtr dst;
  code *pcVar2;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  uint local_11c;
  int local_118;
  int local_114;
  uint local_110;
  uint local_108;
  int local_104;
  int local_fc;
  int local_f8;
  int local_f0;
  float local_ec;
  FuncPtr f;
  gdImagePtr srcback;
  float local_d0;
  float flt_b_sum;
  float flt_g_sum;
  float flt_r_sum;
  float flt_b [3] [3];
  float flt_g [3] [3];
  float flt_r [3] [3];
  int new_a;
  int pxl;
  int cpxl;
  int new_pxl;
  float new_b;
  float new_g;
  float new_r;
  int j;
  int i;
  int y;
  int x;
  gdImagePtr src_local;
  
  flt_r[2][1] = 0.0;
  if (src == (gdImagePtr)0x0) {
    src_local._4_4_ = 0;
  }
  else {
    dst = gdImageCreateTrueColor(src->sx,src->sy);
    if (dst == (gdImagePtr)0x0) {
      src_local._4_4_ = 0;
    }
    else {
      gdImageCopy(dst,src,0,0,0,0,src->sx,src->sy);
      pcVar2 = gdImageGetPixel;
      if (src->trueColor != 0) {
        pcVar2 = gdImageGetTrueColorPixel;
      }
      for (j = 0; j < src->sy; j = j + 1) {
        for (i = 0; i < src->sx; i = i + 1) {
          srcback._4_4_ = 0.0;
          local_d0 = 0.0;
          flt_b_sum = 0.0;
          uVar1 = (*pcVar2)(src,i,j);
          for (new_g = 0.0; (int)new_g < 3; new_g = (float)((int)new_g + 1)) {
            for (new_r = 0.0; (int)new_r < 3; new_r = (float)((int)new_r + 1)) {
              if ((new_g == 1.4013e-45) && (new_r == 1.4013e-45)) {
                flt_b[0][2] = 0.5;
                flt_g[0][2] = 0.5;
                flt_r[0][2] = 0.5;
              }
              else {
                flt_r[2][2] = (float)(*pcVar2)(src,i + -1 + (int)new_r,j + -1 + (int)new_g);
                if (dst->trueColor == 0) {
                  local_ec = (float)dst->alpha[(int)flt_r[2][2]];
                }
                else {
                  local_ec = (float)((int)((uint)flt_r[2][2] & 0x7f000000) >> 0x18);
                }
                flt_r[2][1] = local_ec;
                if (dst->trueColor == 0) {
                  local_f0 = dst->red[(int)uVar1];
                }
                else {
                  local_f0 = (int)(uVar1 & 0xff0000) >> 0x10;
                }
                if (dst->trueColor == 0) {
                  local_f8 = dst->red[(int)flt_r[2][2]];
                }
                else {
                  local_f8 = (int)((uint)flt_r[2][2] & 0xff0000) >> 0x10;
                }
                new_b = (float)local_f0 - (float)local_f8;
                if (new_b < 0.0) {
                  new_b = -new_b;
                }
                if ((new_b != 0.0) || (NAN(new_b))) {
                  flt_r[(long)(int)new_g + -1][(long)(int)new_r + 1] = 1.0 / new_b;
                }
                else {
                  flt_r[(long)(int)new_g + -1][(long)(int)new_r + 1] = 1.0;
                }
                if (dst->trueColor == 0) {
                  local_fc = dst->green[(int)uVar1];
                }
                else {
                  local_fc = (int)(uVar1 & 0xff00) >> 8;
                }
                if (dst->trueColor == 0) {
                  local_104 = dst->green[(int)flt_r[2][2]];
                }
                else {
                  local_104 = (int)((uint)flt_r[2][2] & 0xff00) >> 8;
                }
                new_pxl = (int)((float)local_fc - (float)local_104);
                if ((float)new_pxl < 0.0) {
                  new_pxl = (int)-(float)new_pxl;
                }
                if (((float)new_pxl != 0.0) || (NAN((float)new_pxl))) {
                  flt_g[(long)(int)new_g + -1][(long)(int)new_r + 1] = 1.0 / (float)new_pxl;
                }
                else {
                  flt_g[(long)(int)new_g + -1][(long)(int)new_r + 1] = 1.0;
                }
                if (dst->trueColor == 0) {
                  local_108 = dst->blue[(int)uVar1];
                }
                else {
                  local_108 = uVar1 & 0xff;
                }
                if (dst->trueColor == 0) {
                  local_110 = dst->blue[(int)flt_r[2][2]];
                }
                else {
                  local_110 = (uint)flt_r[2][2] & 0xff;
                }
                cpxl = (int)((float)(int)local_108 - (float)(int)local_110);
                if ((float)cpxl < 0.0) {
                  cpxl = (int)-(float)cpxl;
                }
                if (((float)cpxl != 0.0) || (NAN((float)cpxl))) {
                  (&flt_g_sum)[(long)(int)new_g * 3 + (long)(int)new_r] = 1.0 / (float)cpxl;
                }
                else {
                  (&flt_g_sum)[(long)(int)new_g * 3 + (long)(int)new_r] = 1.0;
                }
              }
              flt_b_sum = flt_r[(long)(int)new_g + -1][(long)(int)new_r + 1] + flt_b_sum;
              local_d0 = flt_g[(long)(int)new_g + -1][(long)(int)new_r + 1] + local_d0;
              srcback._4_4_ = (&flt_g_sum)[(long)(int)new_g * 3 + (long)(int)new_r] + srcback._4_4_;
            }
          }
          for (new_g = 0.0; (int)new_g < 3; new_g = (float)((int)new_g + 1)) {
            for (new_r = 0.0; (int)new_r < 3; new_r = (float)((int)new_r + 1)) {
              if ((flt_b_sum != 0.0) || (NAN(flt_b_sum))) {
                flt_r[(long)(int)new_g + -1][(long)(int)new_r + 1] =
                     flt_r[(long)(int)new_g + -1][(long)(int)new_r + 1] / flt_b_sum;
              }
              if ((local_d0 != 0.0) || (NAN(local_d0))) {
                flt_g[(long)(int)new_g + -1][(long)(int)new_r + 1] =
                     flt_g[(long)(int)new_g + -1][(long)(int)new_r + 1] / local_d0;
              }
              if ((srcback._4_4_ != 0.0) || (NAN(srcback._4_4_))) {
                (&flt_g_sum)[(long)(int)new_g * 3 + (long)(int)new_r] =
                     (&flt_g_sum)[(long)(int)new_g * 3 + (long)(int)new_r] / srcback._4_4_;
              }
            }
          }
          cpxl = 0;
          new_pxl = 0;
          new_b = 0.0;
          for (new_g = 0.0; (int)new_g < 3; new_g = (float)((int)new_g + 1)) {
            for (new_r = 0.0; (int)new_r < 3; new_r = (float)((int)new_r + 1)) {
              flt_r[2][2] = (float)(*pcVar2)(src,i + -1 + (int)new_r,j + -1 + (int)new_g);
              if (dst->trueColor == 0) {
                local_114 = dst->red[(int)flt_r[2][2]];
              }
              else {
                local_114 = (int)((uint)flt_r[2][2] & 0xff0000) >> 0x10;
              }
              new_b = (float)local_114 * flt_r[(long)(int)new_g + -1][(long)(int)new_r + 1] + new_b;
              if (dst->trueColor == 0) {
                local_118 = dst->green[(int)flt_r[2][2]];
              }
              else {
                local_118 = (int)((uint)flt_r[2][2] & 0xff00) >> 8;
              }
              new_pxl = (int)((float)local_118 * flt_g[(long)(int)new_g + -1][(long)(int)new_r + 1]
                             + (float)new_pxl);
              if (dst->trueColor == 0) {
                local_11c = dst->blue[(int)flt_r[2][2]];
              }
              else {
                local_11c = (uint)flt_r[2][2] & 0xff;
              }
              cpxl = (int)((float)(int)local_11c *
                           (&flt_g_sum)[(long)(int)new_g * 3 + (long)(int)new_r] + (float)cpxl);
            }
          }
          if (new_b <= 255.0) {
            if (0.0 <= new_b) {
              local_124 = new_b;
            }
            else {
              local_124 = 0.0;
            }
            local_120 = local_124;
          }
          else {
            local_120 = 255.0;
          }
          if ((float)new_pxl <= 255.0) {
            if (0.0 <= (float)new_pxl) {
              local_12c = (float)new_pxl;
            }
            else {
              local_12c = 0.0;
            }
            local_128 = local_12c;
          }
          else {
            local_128 = 255.0;
          }
          if ((float)cpxl <= 255.0) {
            if (0.0 <= (float)cpxl) {
              local_134 = (float)cpxl;
            }
            else {
              local_134 = 0.0;
            }
            local_130 = local_134;
          }
          else {
            local_130 = 255.0;
          }
          pxl = gdImageColorAllocateAlpha
                          (src,(int)local_120,(int)local_128,(int)local_130,(int)flt_r[2][1]);
          if (pxl == -1) {
            pxl = gdImageColorClosestAlpha
                            (src,(int)local_120,(int)local_128,(int)local_130,(int)flt_r[2][1]);
          }
          gdImageSetPixel(src,i,j,pxl);
        }
      }
      gdImageDestroy(dst);
      src_local._4_4_ = 1;
    }
  }
  return src_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageSelectiveBlur( gdImagePtr src)
{
	int         x, y, i, j;
	float       new_r, new_g, new_b;
	int         new_pxl, cpxl, pxl, new_a=0;
	float flt_r [3][3];
	float flt_g [3][3];
	float flt_b [3][3];
	float flt_r_sum, flt_g_sum, flt_b_sum;

	gdImagePtr srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}
	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for(y = 0; y<src->sy; y++) {
		for (x=0; x<src->sx; x++) {
		      flt_r_sum = flt_g_sum = flt_b_sum = 0.0;
			cpxl = f(src, x, y);

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if ((j == 1) && (i == 1)) {
						flt_r[1][1] = flt_g[1][1] = flt_b[1][1] = 0.5;
					} else {
						pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
						new_a = gdImageAlpha(srcback, pxl);

						new_r = ((float)gdImageRed(srcback, cpxl)) - ((float)gdImageRed (srcback, pxl));

						if (new_r < 0.0f) {
							new_r = -new_r;
						}
						if (new_r != 0) {
							flt_r[j][i] = 1.0f/new_r;
						} else {
							flt_r[j][i] = 1.0f;
						}

						new_g = ((float)gdImageGreen(srcback, cpxl)) - ((float)gdImageGreen(srcback, pxl));

						if (new_g < 0.0f) {
							new_g = -new_g;
						}
						if (new_g != 0) {
							flt_g[j][i] = 1.0f/new_g;
						} else {
							flt_g[j][i] = 1.0f;
						}

						new_b = ((float)gdImageBlue(srcback, cpxl)) - ((float)gdImageBlue(srcback, pxl));

						if (new_b < 0.0f) {
							new_b = -new_b;
						}
						if (new_b != 0) {
							flt_b[j][i] = 1.0f/new_b;
						} else {
							flt_b[j][i] = 1.0f;
						}
					}

					flt_r_sum += flt_r[j][i];
					flt_g_sum += flt_g[j][i];
					flt_b_sum += flt_b [j][i];
				}
			}

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					if (flt_r_sum != 0.0) {
						flt_r[j][i] /= flt_r_sum;
					}
					if (flt_g_sum != 0.0) {
						flt_g[j][i] /= flt_g_sum;
					}
					if (flt_b_sum != 0.0) {
						flt_b [j][i] /= flt_b_sum;
					}
				}
			}

			new_r = new_g = new_b = 0.0;

			for (j=0; j<3; j++) {
				for (i=0; i<3; i++) {
					pxl = f(src, x-(3>>1)+i, y-(3>>1)+j);
					new_r += (float)gdImageRed(srcback, pxl) * flt_r[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * flt_g[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * flt_b[j][i];
				}
			}

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);
			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}